

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.h
# Opt level: O2

int __thiscall llbuild::basic::ProcessGroup::remove(ProcessGroup *this,char *__filename)

{
  int iVar1;
  undefined4 local_1c;
  
  local_1c = SUB84(__filename,0);
  std::mutex::lock(&this->mutex);
  std::
  _Hashtable<int,_std::pair<const_int,_llbuild::basic::ProcessInfo>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<int,_std::pair<const_int,_llbuild::basic::ProcessInfo>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)this,&local_1c);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  iVar1 = std::condition_variable::notify_all();
  return iVar1;
}

Assistant:

void remove(llbuild_pid_t pid) {
        {
          std::lock_guard<std::mutex> lock(mutex);
          processes.erase(pid);
        }
        processesCondition.notify_all();
      }